

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void FreeStorage(ScanLineListBlock *pSLLBlock)

{
  void *pvVar1;
  void *in_RDI;
  ScanLineListBlock *tmpSLLBlock;
  undefined8 local_8;
  
  local_8 = in_RDI;
  while (local_8 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_8 + 600);
    free(local_8);
    local_8 = pvVar1;
  }
  return;
}

Assistant:

static void FreeStorage(ScanLineListBlock *pSLLBlock)
{
    ScanLineListBlock *tmpSLLBlock;

    while (pSLLBlock) {
        tmpSLLBlock = pSLLBlock->next;
        free(pSLLBlock);
        pSLLBlock = tmpSLLBlock;
    }
}